

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor *
ggml_ssm_scan(ggml_context *ctx,ggml_tensor *s,ggml_tensor *x,ggml_tensor *dt,ggml_tensor *A,
             ggml_tensor *B,ggml_tensor *C)

{
  long lVar1;
  long lVar2;
  long lVar3;
  _Bool _Var4;
  ggml_tensor *pgVar5;
  char *pcVar6;
  int line;
  
  _Var4 = ggml_is_contiguous_0(s);
  if (_Var4) {
    _Var4 = ggml_is_contiguous_0(x);
    if (_Var4) {
      _Var4 = ggml_is_contiguous_0(dt);
      if (_Var4) {
        _Var4 = ggml_is_contiguous_0(A);
        if (_Var4) {
          if ((A->ne[2] == 1) && (A->ne[3] == 1)) {
            if (B->ne[3] == 1) {
              if (s->ne[3] == 1) {
                if (B->nb[0] == type_traits[B->type].type_size) {
                  if (C->nb[0] == type_traits[C->type].type_size) {
                    _Var4 = ggml_are_same_shape(x,dt);
                    if (_Var4) {
                      _Var4 = ggml_are_same_shape(B,C);
                      if (_Var4) {
                        lVar1 = x->ne[2];
                        if (s->ne[2] == lVar1) {
                          lVar2 = s->ne[1];
                          if (x->ne[0] == lVar2) {
                            lVar3 = s->ne[0];
                            if (A->ne[0] == lVar3) {
                              if (A->ne[1] == lVar2) {
                                if (B->ne[0] == lVar3) {
                                  if (B->ne[1] == x->ne[1]) {
                                    if (B->ne[2] == lVar1) {
                                      pgVar5 = ggml_new_tensor_1d(ctx,GGML_TYPE_F32,
                                                                  lVar3 * lVar2 * lVar1 +
                                                                  x->ne[1] * lVar1 * lVar2 *
                                                                  x->ne[3]);
                                      pgVar5->op = GGML_OP_SSM_SCAN;
                                      pgVar5->src[0] = s;
                                      pgVar5->src[1] = x;
                                      pgVar5->src[2] = dt;
                                      pgVar5->src[3] = A;
                                      pgVar5->src[4] = B;
                                      pgVar5->src[5] = C;
                                      return pgVar5;
                                    }
                                    pcVar6 = "B->ne[2] == n_seqs";
                                    line = 0x11ee;
                                  }
                                  else {
                                    pcVar6 = "B->ne[1] == n_seq_tokens";
                                    line = 0x11ed;
                                  }
                                }
                                else {
                                  pcVar6 = "B->ne[0] == d_state";
                                  line = 0x11ec;
                                }
                              }
                              else {
                                pcVar6 = "A->ne[1] == d_inner";
                                line = 0x11eb;
                              }
                            }
                            else {
                              pcVar6 = "A->ne[0] == d_state";
                              line = 0x11ea;
                            }
                          }
                          else {
                            pcVar6 = "x->ne[0] == d_inner";
                            line = 0x11e9;
                          }
                        }
                        else {
                          pcVar6 = "s->ne[2] == n_seqs";
                          line = 0x11e8;
                        }
                      }
                      else {
                        pcVar6 = "ggml_are_same_shape(B, C)";
                        line = 0x11e0;
                      }
                    }
                    else {
                      pcVar6 = "ggml_are_same_shape(x, dt)";
                      line = 0x11df;
                    }
                  }
                  else {
                    pcVar6 = "C->nb[0] == ggml_type_size(C->type)";
                    line = 0x11de;
                  }
                }
                else {
                  pcVar6 = "B->nb[0] == ggml_type_size(B->type)";
                  line = 0x11dd;
                }
              }
              else {
                pcVar6 = "ggml_is_3d(s)";
                line = 0x11dc;
              }
            }
            else {
              pcVar6 = "ggml_is_3d(B)";
              line = 0x11db;
            }
          }
          else {
            pcVar6 = "ggml_is_matrix(A)";
            line = 0x11da;
          }
        }
        else {
          pcVar6 = "ggml_is_contiguous(A)";
          line = 0x11d9;
        }
      }
      else {
        pcVar6 = "ggml_is_contiguous(dt)";
        line = 0x11d8;
      }
    }
    else {
      pcVar6 = "ggml_is_contiguous(x)";
      line = 0x11d7;
    }
  }
  else {
    pcVar6 = "ggml_is_contiguous(s)";
    line = 0x11d6;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",line,
             "GGML_ASSERT(%s) failed",pcVar6);
}

Assistant:

struct ggml_tensor * ggml_ssm_scan(
        struct ggml_context * ctx,
        struct ggml_tensor  * s,
        struct ggml_tensor  * x,
        struct ggml_tensor  * dt,
        struct ggml_tensor  * A,
        struct ggml_tensor  * B,
        struct ggml_tensor  * C) {
    GGML_ASSERT(ggml_is_contiguous(s));
    GGML_ASSERT(ggml_is_contiguous(x));
    GGML_ASSERT(ggml_is_contiguous(dt));
    GGML_ASSERT(ggml_is_contiguous(A));
    GGML_ASSERT(ggml_is_matrix(A));
    GGML_ASSERT(ggml_is_3d(B));
    GGML_ASSERT(ggml_is_3d(s));
    GGML_ASSERT(B->nb[0] == ggml_type_size(B->type));
    GGML_ASSERT(C->nb[0] == ggml_type_size(C->type));
    GGML_ASSERT(ggml_are_same_shape(x, dt));
    GGML_ASSERT(ggml_are_same_shape(B, C));

    {
        const int64_t d_state      = s->ne[0];
        const int64_t d_inner      = s->ne[1];
        const int64_t n_seq_tokens = x->ne[1];
        const int64_t n_seqs       = x->ne[2];

        GGML_ASSERT(s->ne[2] == n_seqs);
        GGML_ASSERT(x->ne[0] == d_inner);
        GGML_ASSERT(A->ne[0] == d_state);
        GGML_ASSERT(A->ne[1] == d_inner);
        GGML_ASSERT(B->ne[0] == d_state);
        GGML_ASSERT(B->ne[1] == n_seq_tokens);
        GGML_ASSERT(B->ne[2] == n_seqs);
    }

    // concatenated y + ssm_states
    struct ggml_tensor * result = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, ggml_nelements(x) + ggml_nelements(s));

    result->op   = GGML_OP_SSM_SCAN;
    result->src[0] = s;
    result->src[1] = x;
    result->src[2] = dt;
    result->src[3] = A;
    result->src[4] = B;
    result->src[5] = C;

    return result;
}